

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.cpp
# Opt level: O0

void __thiscall HTTPRequest::HTTPRequest(HTTPRequest *this,char *request,int requestSize)

{
  bool bVar1;
  long lVar2;
  istream *piVar3;
  reference pvVar4;
  char *pcVar5;
  string *__a;
  mapped_type *__str;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  string reqStr;
  string header;
  string word_1;
  stringstream ss;
  size_type pos;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string firstLine;
  int i;
  stringstream firstLineSS;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  value_type *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  key_type *in_stack_fffffffffffffa98;
  key_type *__k;
  mapped_type *in_stack_fffffffffffffaa0;
  allocator<char> local_4d9;
  string local_4d8 [32];
  string local_4b8 [32];
  _Self local_498;
  undefined1 local_489 [33];
  _Self local_468;
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  stringstream local_400 [16];
  ostream local_3f0 [376];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  long local_218;
  string local_210 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  undefined4 local_1d4;
  string local_1d0 [32];
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10aa39);
  std::__cxx11::string::string(in_RDI + 0x90);
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1b0 = 0;
      ((local_1b0 < local_14 && (*(char *)(local_10 + local_1b0) != '\n')) &&
      (*(char *)(local_10 + local_1b0) != '\0')); local_1b0 = local_1b0 + 1) {
    std::operator<<(local_190,*(char *)(local_10 + local_1b0));
  }
  std::__cxx11::stringstream::str();
  lVar2 = std::__cxx11::string::find((char *)local_1d0,0x10f33c);
  if (lVar2 == -1) {
    in_RDI[0xb0] = (string)0x0;
    local_1d4 = 1;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x10ab90);
    std::__cxx11::string::string(local_210);
    while( true ) {
      piVar3 = std::operator>>((istream *)local_1a0,local_210);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    }
    local_1d4 = 5;
    std::__cxx11::string::~string(local_210);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1f0,0);
    std::__cxx11::string::operator=(in_RDI,(string *)pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1f0,1);
    std::__cxx11::string::operator=(in_RDI + 0x20,(string *)pvVar4);
    local_218 = std::__cxx11::string::find((char *)(in_RDI + 0x20),0x10f345);
    if (local_218 == -1) {
      std::__cxx11::string::operator=(in_RDI + 0x40,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_238,(ulong)(in_RDI + 0x20));
      std::__cxx11::string::operator=(in_RDI + 0x40,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::substr((ulong)local_258,(ulong)(in_RDI + 0x20));
      std::__cxx11::string::operator=(in_RDI + 0x20,local_258);
      std::__cxx11::string::~string(local_258);
    }
    std::__cxx11::string::substr((ulong)local_278,(ulong)(in_RDI + 0x20));
    std::__cxx11::string::operator=(in_RDI + 0x20,local_278);
    std::__cxx11::string::~string(local_278);
    bVar1 = std::operator==(in_stack_fffffffffffffa60,
                            (char *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    if (bVar1) {
      std::__cxx11::string::operator=(in_RDI + 0x20,(string *)&ENTRYPOINT_abi_cxx11_);
    }
    std::__cxx11::stringstream::stringstream(local_400);
    for (; local_1b0 < local_14; local_1b0 = local_1b0 + 1) {
      std::operator<<(local_3f0,*(char *)(local_10 + local_1b0));
    }
    std::__cxx11::string::string(local_420);
    while( true ) {
      piVar3 = std::operator>>((istream *)local_400,local_420);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      pcVar5 = (char *)std::__cxx11::string::back();
      if (*pcVar5 == ':') {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_440,(ulong)local_420);
        std::operator>>((istream *)local_400,local_420);
        in_stack_fffffffffffffaa0 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        std::__cxx11::string::operator=((string *)in_stack_fffffffffffffaa0,local_420);
        std::__cxx11::string::~string(local_440);
      }
    }
    local_1d4 = 10;
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::operator=(in_RDI + 0x90,"");
    std::__cxx11::stringstream::str();
    __a = in_RDI + 0x60;
    __k = (key_type *)local_489;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaa0,(char *)__k,(allocator<char> *)__a);
    local_468._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                (key_type *)0x10b086);
    local_498._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    bVar1 = std::operator!=(&local_468,&local_498);
    std::__cxx11::string::~string((string *)(local_489 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_489);
    if (bVar1) {
      std::__cxx11::string::size();
      in_stack_fffffffffffffa70 = in_RDI + 0x60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffaa0,(char *)__k,(allocator<char> *)__a);
      __str = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffaa0,__k);
      std::__cxx11::stoi(__str,(size_t *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),0);
      std::__cxx11::string::substr((ulong)local_4b8,(ulong)local_460);
      std::__cxx11::string::operator=(in_RDI + 0x90,local_4b8);
      std::__cxx11::string::~string(local_4b8);
      std::__cxx11::string::~string(local_4d8);
      std::allocator<char>::~allocator(&local_4d9);
    }
    in_RDI[0xb0] = (string)0x1;
    std::__cxx11::string::~string(local_460);
    std::__cxx11::stringstream::~stringstream(local_400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa70);
    local_1d4 = 0;
  }
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

HTTPRequest::HTTPRequest(char* request, int requestSize)
{
    std::stringstream firstLineSS;
    int i = 0;
    for (i = 0; i < requestSize; i++)
    {
        if (request[i] == '\n' || request[i] == 0) break;
        firstLineSS << request[i];
    }
    std::string firstLine = firstLineSS.str();
    if (firstLine.find("HTTP/1.1") == std::string::npos)
    {
        valid = false;
        return;
    }
    std::vector<std::string> words;
    for (std::string word; firstLineSS >> word;)
        words.push_back(word);
    
    method = words[0];
    filepath = words[1];

    auto pos = filepath.find("?");
    if (pos != std::string::npos)
    {
        query = filepath.substr(pos + 1);
        filepath = filepath.substr(0, pos);
    }
    else query = "";
    filepath = filepath.substr(1);
    if (filepath == "") filepath = ENTRYPOINT;
    
    std::stringstream ss;
    for (; i < requestSize; i++) ss << request[i];
    for (std::string word; ss >> word;)
    {
        if (word.back() != ':') continue;
        std::string header = word.substr(0, word.size() - 1);
        ss >> word;
        headers[header] = word;
    }
    body = "";
    std::string reqStr = ss.str();
    if (headers.find("Content-Length") != headers.end())
        body = reqStr.substr(reqStr.size() - stoi(headers["Content-Length"]));

    valid = true;
}